

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

void gen_trigrams(uint8_t *mem,uint64_t size,TrigramCallback *cb)

{
  uint __args;
  uint64_t offset;
  uint64_t uVar1;
  
  if (2 < size) {
    __args = (uint)(ushort)(*(ushort *)mem << 8 | *(ushort *)mem >> 8);
    for (uVar1 = 2; size != uVar1; uVar1 = uVar1 + 1) {
      __args = (uint)mem[uVar1] | (__args & 0xffff) << 8;
      std::function<void_(unsigned_int)>::operator()(cb,__args);
    }
  }
  return;
}

Assistant:

void gen_trigrams(const uint8_t *mem, uint64_t size,
                  const TrigramCallback &cb) {
    if (size < 3) {
        return;
    }

    uint32_t gram3 = (mem[0] << 8U) | mem[1];

    for (uint64_t offset = 2; offset < size; offset++) {
        gram3 = ((gram3 & 0xFFFFU) << 8U) | mem[offset];
        cb(gram3);
    }
}